

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

void __thiscall
icu_63::RuleBasedNumberFormat::RuleBasedNumberFormat
          (RuleBasedNumberFormat *this,URBNFRuleSetTag tag,Locale *alocale,UErrorCode *status)

{
  int iVar1;
  UBool UVar2;
  UResourceBundle *resourceBundle;
  char *valid;
  char *actual;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  UnicodeString desc;
  UParseError perror;
  
  NumberFormat::NumberFormat(&this->super_NumberFormat);
  (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedNumberFormat_003a4530;
  this->defaultRuleSet = (NFRuleSet *)0x0;
  this->fRuleSets = (NFRuleSet **)0x0;
  this->ruleSetDescriptions = (UnicodeString *)0x0;
  this->numRuleSets = 0;
  Locale::Locale(&this->locale,alocale);
  this->defaultInfinityRule = (NFRule *)0x0;
  this->defaultNaNRule = (NFRule *)0x0;
  this->collator = (RuleBasedCollator *)0x0;
  this->decimalFormatSymbols = (DecimalFormatSymbols *)0x0;
  this->fRoundingMode = kRoundUnnecessary;
  this->lenient = '\0';
  this->lenientParseRules = (UnicodeString *)0x0;
  this->localizations = (LocalizationInfo *)0x0;
  (this->originalDescription).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b1268;
  (this->originalDescription).fUnion.fStackFields.fLengthAndFlags = 2;
  this->capitalizationInfoSet = '\0';
  this->capitalizationForUIListMenu = '\0';
  this->capitalizationForStandAlone = '\0';
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (tag < URBNF_COUNT) {
      iVar1 = *(int *)(&DAT_002e4938 + (ulong)tag * 4);
      resourceBundle = ures_open_63("icudt63l-rbnf",(this->locale).fullName,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        valid = ures_getLocaleByType_63(resourceBundle,ULOC_VALID_LOCALE,status);
        actual = ures_getLocaleByType_63(resourceBundle,ULOC_ACTUAL_LOCALE,status);
        Format::setLocaleIDs((Format *)this,valid,actual);
        resB = ures_getByKeyWithFallback_63
                         (resourceBundle,"RBNFRules",(UResourceBundle *)0x0,status);
        if (U_ZERO_ERROR < *status) {
          ures_close_63(resourceBundle);
        }
        resB_00 = ures_getByKeyWithFallback_63
                            (resB,&DAT_002e4938 + iVar1,(UResourceBundle *)0x0,status);
        if (U_ZERO_ERROR < *status) {
          ures_close_63(resB);
          ures_close_63(resourceBundle);
          return;
        }
        desc.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b1268;
        desc.fUnion.fStackFields.fLengthAndFlags = 2;
        while (UVar2 = ures_hasNext_63(resB_00), UVar2 != '\0') {
          ures_getNextUnicodeString((UnicodeString *)&perror,resB_00,(char **)0x0,status);
          UnicodeString::append(&desc,(UnicodeString *)&perror);
          UnicodeString::~UnicodeString((UnicodeString *)&perror);
        }
        init(this,(EVP_PKEY_CTX *)&desc);
        ures_close_63(resB_00);
        ures_close_63(resB);
        UnicodeString::~UnicodeString(&desc);
      }
      ures_close_63(resourceBundle);
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

RuleBasedNumberFormat::RuleBasedNumberFormat(URBNFRuleSetTag tag, const Locale& alocale, UErrorCode& status)
  : fRuleSets(NULL)
  , ruleSetDescriptions(NULL)
  , numRuleSets(0)
  , defaultRuleSet(NULL)
  , locale(alocale)
  , collator(NULL)
  , decimalFormatSymbols(NULL)
  , defaultInfinityRule(NULL)
  , defaultNaNRule(NULL)
  , fRoundingMode(DecimalFormat::ERoundingMode::kRoundUnnecessary)
  , lenient(FALSE)
  , lenientParseRules(NULL)
  , localizations(NULL)
  , capitalizationInfoSet(FALSE)
  , capitalizationForUIListMenu(FALSE)
  , capitalizationForStandAlone(FALSE)
  , capitalizationBrkIter(NULL)
{
    if (U_FAILURE(status)) {
        return;
    }

    const char* rules_tag = "RBNFRules";
    const char* fmt_tag = "";
    switch (tag) {
    case URBNF_SPELLOUT: fmt_tag = "SpelloutRules"; break;
    case URBNF_ORDINAL: fmt_tag = "OrdinalRules"; break;
    case URBNF_DURATION: fmt_tag = "DurationRules"; break;
    case URBNF_NUMBERING_SYSTEM: fmt_tag = "NumberingSystemRules"; break;
    default: status = U_ILLEGAL_ARGUMENT_ERROR; return;
    }

    // TODO: read localization info from resource
    LocalizationInfo* locinfo = NULL;

    UResourceBundle* nfrb = ures_open(U_ICUDATA_RBNF, locale.getName(), &status);
    if (U_SUCCESS(status)) {
        setLocaleIDs(ures_getLocaleByType(nfrb, ULOC_VALID_LOCALE, &status),
                     ures_getLocaleByType(nfrb, ULOC_ACTUAL_LOCALE, &status));

        UResourceBundle* rbnfRules = ures_getByKeyWithFallback(nfrb, rules_tag, NULL, &status);
        if (U_FAILURE(status)) {
            ures_close(nfrb);
        }
        UResourceBundle* ruleSets = ures_getByKeyWithFallback(rbnfRules, fmt_tag, NULL, &status);
        if (U_FAILURE(status)) {
            ures_close(rbnfRules);
            ures_close(nfrb);
            return;
        }

        UnicodeString desc;
        while (ures_hasNext(ruleSets)) {
           desc.append(ures_getNextUnicodeString(ruleSets,NULL,&status));
        }
        UParseError perror;

        init(desc, locinfo, perror, status);

        ures_close(ruleSets);
        ures_close(rbnfRules);
    }
    ures_close(nfrb);
}